

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O2

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::computeDRMatrix_asQuat
          (DeadReckoningCalculator *this,TMATRIX *res,KFLOAT32 totalTimeSinceReset)

{
  double dVar1;
  double dVar2;
  Vector *this_00;
  float fVar3;
  KFLOAT32 KVar4;
  float fVar5;
  KFLOAT32 KVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  dVar1 = (double)((float)totalTimeSinceReset * (float)this->m_f64Magnitude) * 0.5;
  dVar2 = sin(dVar1);
  fVar3 = (float)dVar2;
  this_00 = &this->m_quatAxis;
  KVar4 = DATA_TYPE::Vector::GetX(this_00);
  fVar5 = (float)KVar4 * fVar3;
  KVar4 = DATA_TYPE::Vector::GetY(this_00);
  KVar6 = DATA_TYPE::Vector::GetZ(this_00);
  dVar1 = cos(dVar1);
  fVar8 = (float)dVar1;
  fVar7 = fVar8 * fVar8;
  res->Data[0][0] = fVar5 * fVar5 + fVar7 + -0.5;
  fVar9 = fVar3 * (float)KVar4;
  fVar3 = fVar3 * (float)KVar6;
  *(ulong *)(res->Data[0] + 1) =
       CONCAT44(fVar5 * fVar3 + fVar9 * fVar8,fVar5 * fVar9 + -(fVar3 * fVar8));
  res->Data[1][0] = fVar5 * fVar9 + fVar3 * fVar8;
  res->Data[1][1] = fVar9 * fVar9 + fVar7 + -0.5;
  res->Data[1][2] = fVar9 * fVar3 - fVar8 * fVar5;
  res->Data[2][0] = fVar5 * fVar3 - fVar9 * fVar8;
  res->Data[2][1] = fVar9 * fVar3 + fVar8 * fVar5;
  res->Data[2][2] = fVar3 * fVar3 + fVar7 + -0.5;
  return;
}

Assistant:

void DeadReckoningCalculator::computeDRMatrix_asQuat( TMATRIX& res, const KFLOAT32 totalTimeSinceReset )
{
    // to be implemented
    // assume that m_quatAxis is set
    KFLOAT32 qx, qy, qz;
    KFLOAT32 q0;
    const KFLOAT64 beta = totalTimeSinceReset * m_f64Magnitude;

    KFLOAT32 sin_beta_2 = sin(beta/2.0f);
    qx = sin_beta_2 * m_quatAxis.GetX();
    qy = sin_beta_2 * m_quatAxis.GetY();
    qz = sin_beta_2 * m_quatAxis.GetZ();
    q0 = cos(beta/2.0f);

    res.Data[0][0] = q0*q0 + qx*qx - 0.5f;
    res.Data[0][1] = qx*qy - q0*qz;
    res.Data[0][2] = qx*qz + q0*qy;

    res.Data[1][0] = qx*qy + q0*qz;
    res.Data[1][1] = q0*q0 + qy*qy - 0.5f;
    res.Data[1][2] = qy*qz - q0*qx;

    res.Data[2][0] = qx*qz - q0*qy;
    res.Data[2][1] = qy*qz + q0*qx;
    res.Data[2][2] = q0*q0 + qz*qz - 0.5f;
}